

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall
QMainWindowLayout::unplug(QMainWindowLayout *this,QWidget *widget,DragScope scope)

{
  QMainWindowLayoutState *this_00;
  QMainWindowLayoutState *this_01;
  long lVar1;
  undefined4 uVar2;
  bool bVar3;
  DockWidgetArea DVar4;
  int iVar5;
  int iVar6;
  QDockWidgetGroupWindow *this_02;
  QLayout *pQVar7;
  QDockAreaLayoutItem *pQVar8;
  QLoggingCategory *pQVar9;
  QDebug *pQVar10;
  QLayoutItem *pQVar11;
  QWidget *pQVar12;
  QDockWidget *pQVar13;
  QDockAreaLayoutInfo *pQVar14;
  int *piVar15;
  QDockWidgetLayout *pQVar16;
  QStyle *pQVar17;
  QSize *pQVar18;
  QToolBar *pQVar19;
  int iVar20;
  char cVar21;
  int iVar22;
  long in_FS_OFFSET;
  undefined1 local_e8 [8];
  QSize local_e0;
  undefined1 local_d8 [8];
  Stream *local_d0;
  undefined1 local_c8 [32];
  QDebug local_a8;
  Stream *local_a0;
  QDebug local_98;
  QLayoutItem *item;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  QPlaceHolderItem *local_78;
  Stream *local_70;
  QDockAreaLayoutItem parentItem;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow_const*,QObject>
                      (*(QObject **)(*(long *)&widget->field_0x8 + 0x10));
  if ((this_02 == (QDockWidgetGroupWindow *)0x0) ||
     (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    this_00 = (QMainWindowLayoutState *)(this + 0x88);
    local_c8._16_4_ = 0xaaaaaaaa;
    local_c8._20_4_ = 0xaaaaaaaa;
    local_c8._0_4_ = 0xaaaaaaaa;
    local_c8._4_4_ = 0xaaaaaaaa;
    local_c8._8_4_ = 0xaaaaaaaa;
    local_c8._12_4_ = 0xaaaaaaaa;
    QMainWindowLayoutState::indexOf((QList<int> *)local_c8,this_00,widget);
    if (CONCAT44(local_c8._20_4_,local_c8._16_4_) == 0) {
      pQVar11 = (QLayoutItem *)0x0;
    }
    else {
      pQVar11 = QMainWindowLayoutState::item(this_00,(QList<int> *)local_c8);
      item = pQVar11;
      if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        _local_88 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)local_c8);
        this_01 = (QMainWindowLayoutState *)(this + 0x3c0);
        QMainWindowLayoutState::operator=(this_01,this_00);
        pQVar12 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject)->
                   super_QWidget;
        if (pQVar12 != (QWidget *)0x0) {
          if (((scope == Group) && (((byte)this[0x700] & 0x20) != 0)) &&
             (3 < CONCAT44(local_c8._20_4_,local_c8._16_4_))) {
            QList<int>::mid((QList<int> *)&parentItem,(QList<int> *)local_c8,1,
                            CONCAT44(local_c8._20_4_,local_c8._16_4_) - 2);
            pQVar8 = QDockAreaLayout::item
                               ((QDockAreaLayout *)(this + 0x1a0),(QList<int> *)&parentItem);
            bVar3 = unplugGroup((QMainWindowLayout *)this,&item,pQVar8);
            QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&parentItem);
            if (bVar3) {
              QList<int>::removeLast((QList<int> *)local_c8);
              QMainWindowLayoutState::operator=(this_01,this_00);
              goto LAB_003ffdf1;
            }
          }
          DVar4 = dockWidgetArea(this,pQVar12);
          if (DVar4 - LeftDockWidgetArea < 2) {
            piVar15 = (int *)(local_88 + 0xc);
LAB_003ffc83:
            *piVar15 = *piVar15 - *(int *)(this + 0x760);
          }
          else if ((DVar4 == BottomDockWidgetArea) || (DVar4 == TopDockWidgetArea)) {
            piVar15 = (int *)(local_88 + 8);
            goto LAB_003ffc83;
          }
          pQVar7 = QWidget::layout(pQVar12);
          pQVar16 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>
                              (&pQVar7->super_QObject);
          if (pQVar16 == (QDockWidgetLayout *)0x0) {
            cVar21 = '\0';
          }
          else {
            cVar21 = (pQVar16->super_QLayout).super_QLayoutItem.field_0xc;
          }
          pQVar17 = QApplication::style();
          if (pQVar17 == (QStyle *)0x0) {
            iVar5 = 0x14;
          }
          else {
            pQVar17 = QApplication::style();
            iVar5 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x1a,0,pQVar12);
          }
          iVar20 = iVar5 * 2;
          if (cVar21 != '\0') {
            iVar20 = iVar5;
            iVar5 = iVar5 * 2;
          }
          uVar2 = local_88._4_4_;
          iVar6 = (uStack_80._0_4_ - local_88._0_4_) + 1;
          iVar22 = (uStack_80._4_4_ - local_88._4_4_) + 1;
          if (iVar6 <= iVar20) {
            iVar6 = iVar20;
          }
          if (iVar22 <= iVar5) {
            iVar22 = iVar5;
          }
          iVar5 = local_88._0_4_ + -1;
          uStack_80._0_4_ = iVar5 + iVar6;
          uStack_80._4_4_ = uVar2 + iVar22 + -1;
          pQVar9 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            parentItem._24_8_ = pQVar9->name;
            parentItem.widgetItem._0_4_ = 2;
            parentItem.widgetItem._4_4_ = 0;
            parentItem.subinfo._0_4_ = 0;
            parentItem.subinfo._4_4_ = 0;
            parentItem.placeHolderItem._0_4_ = 0;
            parentItem.placeHolderItem._4_4_ = 0;
            QMessageLogger::debug();
            ::operator<<((Stream *)&local_98,(QDockWidget *)local_e8);
            pQVar18 = (QSize *)QDebug::operator<<(&local_98,"will be unplugged with size");
            local_e0 = *pQVar18;
            *(int *)((long)local_e0 + 0x28) = *(int *)((long)local_e0 + 0x28) + 1;
            local_a8.stream =
                 (Stream *)
                 CONCAT44((uStack_80._4_4_ - local_88._4_4_) + 1,
                          (uStack_80._0_4_ - local_88._0_4_) + 1);
            ::operator<<((Stream *)local_d8,&local_e0);
            QDebug::~QDebug((QDebug *)local_d8);
            QDebug::~QDebug((QDebug *)&local_e0);
            QDebug::~QDebug(&local_98);
            QDebug::~QDebug((QDebug *)local_e8);
          }
          QDockWidgetPrivate::unplug(*(QDockWidgetPrivate **)&pQVar12->field_0x8,(QRect *)local_88);
        }
LAB_003ffdf1:
        pQVar19 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&widget->super_QObject);
        if (pQVar19 != (QToolBar *)0x0) {
          QToolBarPrivate::unplug
                    (*(QToolBarPrivate **)&(pQVar19->super_QWidget).field_0x8,(QRect *)local_88);
        }
        QMainWindowLayoutState::unplug(this_00,(QList<int> *)local_c8,this_01);
        QMainWindowLayoutState::fitLayout(this_01);
        QArrayDataPointer<int>::operator=
                  ((QArrayDataPointer<int> *)(this + 0x7b0),(QArrayDataPointer<int> *)local_c8);
        *(undefined1 (*) [8])(this + 0x7c8) = local_88;
        *(QDockAreaLayoutInfo **)(this + 2000) = uStack_80;
        updateGapIndicator(this);
        pQVar11 = item;
        fixToolBarOrientation(item,*(int *)(*(long *)(this + 0x7b8) + 4));
      }
    }
    pQVar8 = (QDockAreaLayoutItem *)local_c8;
  }
  else if ((scope == Group) &&
          (pQVar14 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)this_02),
          pQVar14 != (QDockAreaLayoutInfo *)0x0)) {
    pQVar14 = dockInfo(this,*(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
    if (pQVar14 == (QDockAreaLayoutInfo *)0x0) {
      pQVar9 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        parentItem._24_8_ = pQVar9->name;
        parentItem.widgetItem._0_4_ = 2;
        parentItem.widgetItem._4_4_ = 0;
        parentItem.subinfo._0_4_ = 0;
        parentItem.subinfo._4_4_ = 0;
        parentItem.placeHolderItem._0_4_ = 0;
        parentItem.placeHolderItem._4_4_ = 0;
        QMessageLogger::debug();
        pQVar10 = QDebug::operator<<((QDebug *)local_88,"Drag only:");
        local_70 = pQVar10->stream;
        *(int *)(local_70 + 0x28) = *(int *)(local_70 + 0x28) + 1;
        ::operator<<((Stream *)local_c8,(QWidget *)&local_70);
        pQVar10 = QDebug::operator<<((QDebug *)local_c8,"Group:");
        QDebug::operator<<(pQVar10,true);
        QDebug::~QDebug((QDebug *)local_c8);
        QDebug::~QDebug((QDebug *)&local_70);
        QDebug::~QDebug((QDebug *)local_88);
      }
      pQVar11 = (QLayoutItem *)0x0;
      goto LAB_003ffe70;
    }
    parentItem.placeHolderItem._0_4_ = 0xaaaaaaaa;
    parentItem.placeHolderItem._4_4_ = 0xaaaaaaaa;
    parentItem.widgetItem._0_4_ = 0xaaaaaaaa;
    parentItem.widgetItem._4_4_ = 0xaaaaaaaa;
    parentItem.subinfo._0_4_ = 0xaaaaaaaa;
    parentItem.subinfo._4_4_ = 0xaaaaaaaa;
    QDockAreaLayoutInfo::indexOf
              ((QList<int> *)&parentItem,pQVar14,*(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
    if (CONCAT44(parentItem.placeHolderItem._4_4_,parentItem.placeHolderItem._0_4_) == 0) {
      pQVar11 = (QLayoutItem *)0x0;
    }
    else {
      pQVar8 = QDockAreaLayoutInfo::item(pQVar14,(QList<int> *)&parentItem);
      pQVar11 = pQVar8->widgetItem;
    }
    pQVar8 = &parentItem;
  }
  else {
    local_78 = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QWidget::layout(&this_02->super_QWidget);
    QDockAreaLayoutInfo::indexOf
              ((QList<int> *)local_88,(QDockAreaLayoutInfo *)&pQVar7[4].super_QLayoutItem,widget);
    parentItem._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    parentItem.placeHolderItem._0_4_ = 0xaaaaaaaa;
    parentItem.placeHolderItem._4_4_ = 0xaaaaaaaa;
    parentItem._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    parentItem.widgetItem._0_4_ = 0xaaaaaaaa;
    parentItem.widgetItem._4_4_ = 0xaaaaaaaa;
    parentItem.subinfo._0_4_ = 0xaaaaaaaa;
    parentItem.subinfo._4_4_ = 0xaaaaaaaa;
    pQVar7 = QWidget::layout(&this_02->super_QWidget);
    pQVar8 = QDockAreaLayoutInfo::item
                       ((QDockAreaLayoutInfo *)&pQVar7[4].super_QLayoutItem,(QList<int> *)local_88);
    QDockAreaLayoutItem::QDockAreaLayoutItem(&parentItem,pQVar8);
    item = (QLayoutItem *)CONCAT44(parentItem.widgetItem._4_4_,parentItem.widgetItem._0_4_);
    if (((scope == Group) && ((QPlaceHolderItem *)0x1 < local_78)) &&
       (bVar3 = unplugGroup((QMainWindowLayout *)this,&item,&parentItem), bVar3)) {
      pQVar9 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_c8._24_8_ = pQVar9->name;
        local_c8._0_4_ = 2;
        local_c8._4_4_ = 0;
        local_c8._8_4_ = 0;
        local_c8._12_4_ = 0;
        local_c8._16_4_ = 0;
        local_c8._20_4_ = 0;
        QMessageLogger::debug();
        pQVar10 = QDebug::operator<<(&local_a8,"Unplugging:");
        local_a0 = pQVar10->stream;
        pQVar12 = (QWidget *)&local_a0;
        *(int *)(local_a0 + 0x28) = *(int *)(local_a0 + 0x28) + 1;
        ::operator<<((Stream *)&local_98,pQVar12);
        pQVar10 = QDebug::operator<<(&local_98,"from");
        pQVar11 = item;
LAB_003ffada:
        QDebug::operator<<(pQVar10,pQVar11);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug((QDebug *)pQVar12);
        QDebug::~QDebug(&local_a8);
      }
    }
    else {
      pQVar13 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject);
      QDockWidgetPrivate::unplug
                (*(QDockWidgetPrivate **)&(pQVar13->super_QWidget).field_0x8,&widget->data->crect);
      pQVar9 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar9->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_c8._24_8_ = pQVar9->name;
        local_c8._0_4_ = 2;
        local_c8._4_4_ = 0;
        local_c8._8_4_ = 0;
        local_c8._12_4_ = 0;
        local_c8._16_4_ = 0;
        local_c8._20_4_ = 0;
        QMessageLogger::debug();
        pQVar10 = QDebug::operator<<(&local_a8,"Unplugged from floating dock:");
        local_d0 = pQVar10->stream;
        pQVar12 = (QWidget *)&local_d0;
        *(int *)(local_d0 + 0x28) = *(int *)(local_d0 + 0x28) + 1;
        ::operator<<((Stream *)&local_98,pQVar12);
        pQVar10 = QDebug::operator<<(&local_98,"from");
        pQVar11 = (QLayoutItem *)CONCAT44(parentItem.widgetItem._4_4_,parentItem.widgetItem._0_4_);
        goto LAB_003ffada;
      }
    }
    pQVar11 = item;
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&parentItem);
    pQVar8 = (QDockAreaLayoutItem *)local_88;
  }
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)pQVar8);
LAB_003ffe70:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar11;
}

Assistant:

QLayoutItem *QMainWindowLayout::unplug(QWidget *widget, QDockWidgetPrivate::DragScope scope)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    auto *groupWindow = qobject_cast<const QDockWidgetGroupWindow *>(widget->parentWidget());
    if (!widget->isWindow() && groupWindow) {
        if (scope == QDockWidgetPrivate::DragScope::Group && groupWindow->tabLayoutInfo()) {
            // We are just dragging a floating window as it, not need to do anything, we just have to
            // look up the corresponding QWidgetItem* if it exists
            if (QDockAreaLayoutInfo *info = dockInfo(widget->parentWidget())) {
                QList<int> groupWindowPath = info->indexOf(widget->parentWidget());
                return groupWindowPath.isEmpty() ? nullptr : info->item(groupWindowPath).widgetItem;
            }
            qCDebug(lcQpaDockWidgets) << "Drag only:" << widget << "Group:" << (scope == QDockWidgetPrivate::DragScope::Group);
            return nullptr;
        }
        QList<int> path = groupWindow->layoutInfo()->indexOf(widget);
        QDockAreaLayoutItem parentItem = groupWindow->layoutInfo()->item(path);
        QLayoutItem *item = parentItem.widgetItem;
        if (scope == QDockWidgetPrivate::DragScope::Group && path.size() > 1
            && unplugGroup(this, &item, parentItem)) {
            qCDebug(lcQpaDockWidgets) << "Unplugging:" << widget << "from" << item;
            return item;
        } else {
            // We are unplugging a single dock widget from a floating window.
            QDockWidget *dockWidget = qobject_cast<QDockWidget *>(widget);
            Q_ASSERT(dockWidget); // cannot be a QDockWidgetGroupWindow because it's not floating.
            dockWidget->d_func()->unplug(widget->geometry());

            qCDebug(lcQpaDockWidgets) << "Unplugged from floating dock:" << widget << "from" << parentItem.widgetItem;
            return item;
        }
    }
#endif
    QList<int> path = layoutState.indexOf(widget);
    if (path.isEmpty())
        return nullptr;

    QLayoutItem *item = layoutState.item(path);
    if (widget->isWindow())
        return item;

    QRect r = layoutState.itemRect(path);
    savedState = layoutState;

#if QT_CONFIG(dockwidget)
    if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
        Q_ASSERT(path.constFirst() == 1);
#if QT_CONFIG(tabwidget)
        if (scope == QDockWidgetPrivate::DragScope::Group && (dockOptions & QMainWindow::GroupedDragging) && path.size() > 3
            && unplugGroup(this, &item,
                           layoutState.dockAreaLayout.item(path.mid(1, path.size() - 2)))) {
            path.removeLast();
            savedState = layoutState;
        } else
#endif // QT_CONFIG(tabwidget)
        {
            // Dock widget is unplugged from a main window dock
            // => height or width need to be decreased by separator size
            switch (dockWidgetArea(dw)) {
            case Qt::LeftDockWidgetArea:
            case Qt::RightDockWidgetArea:
                r.setHeight(r.height() - sep);
                break;
            case Qt::TopDockWidgetArea:
            case Qt::BottomDockWidgetArea:
                r.setWidth(r.width() - sep);
                break;
            case Qt::NoDockWidgetArea:
            case Qt::DockWidgetArea_Mask:
                break;
            }

            // Depending on the title bar layout (vertical / horizontal),
            // width and height have to provide minimum space for window handles
            // and mouse dragging.
            // Assuming horizontal title bar, if the dock widget does not have a layout.
            const auto *layout = qobject_cast<QDockWidgetLayout *>(dw->layout());
            const bool verticalTitleBar = layout ? layout->verticalTitleBar : false;
            const int tbHeight = QApplication::style()
                      ? QApplication::style()->pixelMetric(QStyle::PixelMetric::PM_TitleBarHeight, nullptr, dw)
                      : 20;
            const int minHeight = verticalTitleBar ? 2 * tbHeight : tbHeight;
            const int minWidth = verticalTitleBar ? tbHeight : 2 * tbHeight;
            r.setSize(r.size().expandedTo(QSize(minWidth, minHeight)));
            qCDebug(lcQpaDockWidgets) << dw << "will be unplugged with size" << r.size();

            dw->d_func()->unplug(r);
        }
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        tb->d_func()->unplug(r);
    }
#endif

#if !QT_CONFIG(dockwidget) || !QT_CONFIG(tabbar)
    Q_UNUSED(scope);
#endif

    layoutState.unplug(path ,&savedState);
    savedState.fitLayout();
    currentGapPos = path;
    currentGapRect = r;
    updateGapIndicator();

    fixToolBarOrientation(item, currentGapPos.at(1));

    return item;
}